

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O1

LogicalConstant mp::internal::ExprBase::Create<mp::LogicalConstant>(Impl *impl)

{
  AssertionFailure *this;
  
  if ((impl != (Impl *)0x0) && (impl->kind_ != BOOL)) {
    this = (AssertionFailure *)__cxa_allocate_exception(0x10);
    AssertionFailure::AssertionFailure(this,"invalid expression kind");
    __cxa_throw(this,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
  }
  return (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>)
         (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>)impl;
}

Assistant:

static TargetExpr Create(const ExprBase::Impl *impl) {
    MP_ASSERT((!impl || internal::Is<TargetExpr>(impl->kind())),
              "invalid expression kind");
    TargetExpr expr;
    expr.impl_ = impl;
    return expr;
  }